

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_10,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  Type in1;
  Type in0;
  Vec4 *local_e0;
  ulong local_d8;
  float local_d0 [5];
  undefined8 local_bc;
  float local_b4;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a4;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Vector<float,_3> res;
  undefined8 uStack_68;
  Vector<float,_3> res_1;
  undefined8 uStack_38;
  Matrix<float,_4,_3> retVal;
  
  puVar2 = &uStack_68;
  puVar3 = &uStack_68;
  puVar6 = &uStack_68;
  puVar1 = &uStack_38;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar8) = uVar9;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x30);
      lVar7 = lVar7 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar4 = lVar4 + 0x10;
    } while (lVar7 != 4);
    uStack_38 = *(undefined8 *)evalCtx->in[0].m_data;
    retVal.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    retVal.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    retVal.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    retVal.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    retVal.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    retVal.m_data.m_data[1].m_data[2] = 0.0;
    retVal.m_data.m_data[1].m_data[3] = 0.0;
    retVal.m_data.m_data[2].m_data[0] = 0.0;
    retVal.m_data.m_data[2].m_data[1] = 0.0;
    retVal.m_data.m_data[0].m_data[2] = 0.0;
    retVal.m_data.m_data[0].m_data[3] = 0.0;
    retVal.m_data.m_data[1].m_data[0] = 0.0;
    retVal.m_data.m_data[1].m_data[1] = 0.0;
    uStack_38 = 0;
    retVal.m_data.m_data[0].m_data[0] = 0.0;
    retVal.m_data.m_data[0].m_data[1] = 0.0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar4 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar7 * 4) = *(undefined4 *)((long)puVar5 + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0xc);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar8) = uVar9;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x30);
      lVar7 = lVar7 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0x10;
    } while (lVar7 != 4);
    uStack_68 = *(undefined8 *)evalCtx->in[0].m_data;
    res_1.m_data._0_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    stack0xffffffffffffffa8 = *(undefined8 *)evalCtx->in[1].m_data;
  }
  else {
    stack0xffffffffffffffa8 = 0;
    uStack_68 = 0;
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    puVar5 = &DAT_00b1d4e0;
    lVar4 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined4 *)((long)puVar3 + lVar7 * 4) = *(undefined4 *)((long)puVar5 + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0xc);
      lVar4 = lVar4 + 1;
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  puVar1 = &local_98;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  stack0xffffffffffffff90 = 0;
  uStack_84 = 0;
  uStack_80 = 0;
  uStack_7c = 0;
  local_98 = 0;
  uStack_90 = 0;
  lVar4 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar4 != lVar8) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)puVar1 + lVar8) = uVar9;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    lVar4 = lVar4 + 0x10;
  } while (lVar7 != 4);
  puVar1 = &local_98;
  puVar2 = &uStack_38;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      *(float *)((long)puVar1 + lVar7) =
           *(float *)((long)puVar2 + lVar7) * *(float *)((long)puVar6 + lVar7);
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x30);
    lVar4 = lVar4 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar6 = (undefined8 *)((long)puVar6 + 4);
    puVar2 = (undefined8 *)((long)puVar2 + 4);
  } while (lVar4 != 4);
  local_a4 = local_98;
  local_9c = (undefined4)uStack_90;
  local_b0 = CONCAT44(uStack_80,uStack_84);
  local_a8 = uStack_7c;
  local_e0 = (Vec4 *)0x0;
  local_d8 = local_d8 & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(float *)((long)&local_e0 + lVar4 * 4) =
         *(float *)((long)&local_a4 + lVar4 * 4) + *(float *)((long)&local_b0 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_bc = stack0xffffffffffffff90;
  local_b4 = res.m_data[0];
  local_d0[2] = 0.0;
  local_d0[3] = 0.0;
  local_d0[4] = 0.0;
  lVar4 = 0;
  do {
    local_d0[lVar4 + 2] =
         *(float *)((long)&local_e0 + lVar4 * 4) + *(float *)((long)&local_bc + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_e0 = &evalCtx->color;
  local_d8 = 0x100000000;
  local_d0[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_e0 + lVar4 * 4)] = local_d0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}